

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O2

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gles3::Functional::NumSamplesParams>::ParamTest
          (ParamTest<deqp::gles3::Functional::NumSamplesParams> *this,Context *ctx,Params *params)

{
  NumSamplesParams *params_00;
  string sStack_58;
  string local_38;
  
  deqp::gles3::Functional::NumSamplesParams::getName_abi_cxx11_(&local_38,params,params);
  deqp::gles3::Functional::NumSamplesParams::getDescription_abi_cxx11_(&sStack_58,params,params_00);
  TestBase::TestBase(&this->super_TestBase,ctx,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e3c170;
  *(undefined8 *)(this->m_params).numSamples = *(undefined8 *)params->numSamples;
  (this->m_params).numSamples[2] = params->numSamples[2];
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}